

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O0

void __thiscall
helics::apps::Connector::Connector(Connector *this,string_view appName,string *configString)

{
  bool bVar1;
  element_type *peVar2;
  undefined8 *in_RDI;
  string *in_stack_00000178;
  App *in_stack_00000180;
  undefined1 in_stack_00000188 [16];
  shared_ptr<helics::Core> *in_stack_ffffffffffffff68;
  shared_ptr<helics::Core> *in_stack_ffffffffffffff70;
  Connector *this_00;
  shared_ptr<helics::Core> *in_stack_ffffffffffffff88;
  CoreApp *in_stack_ffffffffffffff90;
  bool local_4e;
  
  App::App(in_stack_00000180,(string_view)in_stack_00000188,in_stack_00000178);
  *in_RDI = &PTR__Connector_0094d8a8;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 1));
  if (bVar1) {
    peVar2 = CLI::std::
             __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1eea47);
    Federate::getCorePointer
              ((Federate *)
               ((long)&(peVar2->super_ValueFederate)._vptr_ValueFederate +
               (long)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]));
    CLI::std::shared_ptr<helics::Core>::shared_ptr
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  else {
    CLI::std::shared_ptr<helics::Core>::shared_ptr
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  CoreApp::CoreApp(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (bVar1) {
    std::shared_ptr<helics::Core>::~shared_ptr((shared_ptr<helics::Core> *)0x1eeac0);
  }
  else {
    std::shared_ptr<helics::Core>::~shared_ptr((shared_ptr<helics::Core> *)0x1eeaad);
  }
  this_00 = (Connector *)(in_RDI + 0x1a);
  CLI::std::
  unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>_>
  ::unordered_multimap
            ((unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>_>
              *)0x1eead6);
  CLI::std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>::vector
            ((vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_> *)0x1eeaec
            );
  CLI::std::
  vector<std::shared_ptr<helics::apps::RegexMatcher>,_std::allocator<std::shared_ptr<helics::apps::RegexMatcher>_>_>
  ::vector((vector<std::shared_ptr<helics::apps::RegexMatcher>,_std::allocator<std::shared_ptr<helics::apps::RegexMatcher>_>_>
            *)0x1eeb02);
  CLI::std::
  unordered_map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map((unordered_map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)0x1eeb18);
  CLI::std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x1eeb2e);
  in_RDI[0x35] = 0;
  in_RDI[0x36] = 0;
  *(undefined1 *)(in_RDI + 0x37) = 0;
  *(undefined1 *)((long)in_RDI + 0x1b9) = 0;
  *(undefined1 *)((long)in_RDI + 0x1ba) = 0;
  initialSetup(this_00);
  return;
}

Assistant:

Connector::Connector(std::string_view appName, const std::string& configString):
    App(appName, configString), core((fed) ? fed->getCorePointer() : nullptr)
{
    initialSetup();
}